

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_chromaticities(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  undefined8 *puVar1;
  long in_RSI;
  exr_attr_chromaticities_t tmp;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  exr_result_t local_14;
  
  puVar1 = *(undefined8 **)(in_RSI + 0x18);
  uVar2 = (undefined4)*puVar1;
  uVar3 = (undefined4)((ulong)*puVar1 >> 0x20);
  uVar4 = (undefined4)puVar1[1];
  local_14 = save_attr_sz((_internal_exr_context *)
                          CONCAT44((int)puVar1[2],(int)((ulong)puVar1[1] >> 0x20)),
                          CONCAT44(uVar4,uVar3));
  if (local_14 == 0) {
    local_14 = save_attr_32((_internal_exr_context *)CONCAT44(uVar4,uVar3),
                            (void *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),0);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_chromaticities (
    struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t              rv;
    exr_attr_chromaticities_t tmp = *(a->chromaticities);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_chromaticities_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 8);
    return rv;
}